

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_cancellation_impl.cc
# Opt level: O0

int __thiscall webrtc::EchoCancellationImpl::Enable(EchoCancellationImpl *this,bool enable)

{
  int sample_rate_hz;
  size_t num_reverse_channels;
  size_t num_output_channels;
  bool bVar1;
  ostream *poVar2;
  pointer pSVar3;
  unique_ptr<webrtc::EchoCancellationImpl::StreamProperties,_std::default_delete<webrtc::EchoCancellationImpl::StreamProperties>_>
  *this_00;
  FatalMessage local_1b0;
  FatalMessageVoidify local_35 [13];
  CritScope local_28;
  CritScope cs_capture;
  CritScope cs_render;
  bool enable_local;
  EchoCancellationImpl *this_local;
  
  rtc::CritScope::CritScope(&cs_capture,this->crit_render_);
  rtc::CritScope::CritScope(&local_28,this->crit_capture_);
  if ((enable) && ((this->enabled_ & 1U) == 0)) {
    this->enabled_ = enable;
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stream_properties_);
    if (!bVar1) {
      rtc::FatalMessageVoidify::FatalMessageVoidify(local_35);
      rtc::FatalMessage::FatalMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/echo_cancellation_impl.cc"
                 ,0x10b);
      poVar2 = rtc::FatalMessage::stream(&local_1b0);
      poVar2 = std::operator<<(poVar2,"Check failed: stream_properties_");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"# ");
      rtc::FatalMessageVoidify::operator&(local_35,poVar2);
      rtc::FatalMessage::~FatalMessage(&local_1b0);
    }
    this_00 = &this->stream_properties_;
    pSVar3 = std::
             unique_ptr<webrtc::EchoCancellationImpl::StreamProperties,_std::default_delete<webrtc::EchoCancellationImpl::StreamProperties>_>
             ::operator->(this_00);
    sample_rate_hz = pSVar3->sample_rate_hz;
    pSVar3 = std::
             unique_ptr<webrtc::EchoCancellationImpl::StreamProperties,_std::default_delete<webrtc::EchoCancellationImpl::StreamProperties>_>
             ::operator->(this_00);
    num_reverse_channels = pSVar3->num_reverse_channels;
    pSVar3 = std::
             unique_ptr<webrtc::EchoCancellationImpl::StreamProperties,_std::default_delete<webrtc::EchoCancellationImpl::StreamProperties>_>
             ::operator->(this_00);
    num_output_channels = pSVar3->num_output_channels;
    pSVar3 = std::
             unique_ptr<webrtc::EchoCancellationImpl::StreamProperties,_std::default_delete<webrtc::EchoCancellationImpl::StreamProperties>_>
             ::operator->(this_00);
    Initialize(this,sample_rate_hz,num_reverse_channels,num_output_channels,
               pSVar3->num_proc_channels);
  }
  else {
    this->enabled_ = enable;
  }
  rtc::CritScope::~CritScope(&local_28);
  rtc::CritScope::~CritScope(&cs_capture);
  return 0;
}

Assistant:

int EchoCancellationImpl::Enable(bool enable) {
  // Run in a single-threaded manner.
  rtc::CritScope cs_render(crit_render_);
  rtc::CritScope cs_capture(crit_capture_);

  if (enable && !enabled_) {
    enabled_ = enable;  // Must be set before Initialize() is called.

    // TODO(peah): Simplify once the Enable function has been removed from
    // the public APM API.
    RTC_DCHECK(stream_properties_);
    Initialize(stream_properties_->sample_rate_hz,
               stream_properties_->num_reverse_channels,
               stream_properties_->num_output_channels,
               stream_properties_->num_proc_channels);
  } else {
    enabled_ = enable;
  }
  return AudioProcessing::kNoError;
}